

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O1

void __thiscall argparse::ArgumentParser::~ArgumentParser(ArgumentParser *this)

{
  _List_node_base *p_Var1;
  pointer pcVar2;
  _List_node_base *p_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  std::
  vector<argparse::ArgumentParser::MutuallyExclusiveGroup,_std::allocator<argparse::ArgumentParser::MutuallyExclusiveGroup>_>
  ::~vector(&this->m_mutually_exclusive_groups);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>_>_>
  ::~_Rb_tree(&(this->m_subparser_used)._M_t);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>_>_>_>
  ::~_Rb_tree(&(this->m_subparser_map)._M_t);
  p_Var3 = (this->m_subparsers).
           super__List_base<std::reference_wrapper<argparse::ArgumentParser>,_std::allocator<std::reference_wrapper<argparse::ArgumentParser>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&this->m_subparsers) {
    p_Var1 = p_Var3->_M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var1;
  }
  pcVar2 = (this->m_parser_path)._M_dataplus._M_p;
  paVar4 = &(this->m_parser_path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
  ::~_Rb_tree(&(this->m_argument_map)._M_t);
  std::__cxx11::_List_base<argparse::Argument,_std::allocator<argparse::Argument>_>::_M_clear
            (&(this->m_optional_arguments).
              super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>);
  std::__cxx11::_List_base<argparse::Argument,_std::allocator<argparse::Argument>_>::_M_clear
            (&(this->m_positional_arguments).
              super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>);
  pcVar2 = (this->m_assign_chars)._M_dataplus._M_p;
  paVar4 = &(this->m_assign_chars).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_prefix_chars)._M_dataplus._M_p;
  paVar4 = &(this->m_prefix_chars).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_epilog)._M_dataplus._M_p;
  paVar4 = &(this->m_epilog).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_description)._M_dataplus._M_p;
  paVar4 = &(this->m_description).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_version)._M_dataplus._M_p;
  paVar4 = &(this->m_version).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_program_name)._M_dataplus._M_p;
  paVar4 = &(this->m_program_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    return;
  }
  operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
  return;
}

Assistant:

~ArgumentParser() = default;